

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_printf<int>
          (writer_base<cppwinrt::writer> *this,char *format,int *args)

{
  int iVar1;
  size_t __n;
  void *__buf;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  size_type local_b0;
  size_t size;
  char buffer [128];
  int *args_local;
  char *format_local;
  writer_base<cppwinrt::writer> *this_local;
  
  __n = (size_t)(uint)*args;
  iVar1 = snprintf((char *)&size,0x80,format);
  local_b0 = (size_type)iVar1;
  if (0x7f < local_b0) {
    fprintf(_stderr,"\n*** WARNING: writer_base::write_printf -- buffer too small\n");
    local_b0 = 0x7f;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,(char *)&size,local_b0);
  write(this,(int)&local_c0,__buf,__n);
  return;
}

Assistant:

void write_printf(char const* format, Args const&... args)
        {
            char buffer[128];
#if defined(_WIN32) || defined(_WIN64)
            size_t const size = sprintf_s(buffer, format, args...);
#else
            size_t size = snprintf(buffer, sizeof(buffer), format, args...);
            if (size > sizeof(buffer) - 1)
            {
                fprintf(stderr, "\n*** WARNING: writer_base::write_printf -- buffer too small\n");
                size = sizeof(buffer) - 1;
            }
#endif
            write(std::string_view{ buffer, size });
        }